

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O1

CommandOptions * write_dolby_atmos_file(CommandOptions *Options)

{
  Result_t *this;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  AESEncContext *this_00;
  HMACContext *this_01;
  long lVar11;
  CommandOptions *in_RSI;
  MyInfo *pMVar12;
  undefined8 *puVar13;
  uint uVar14;
  byte bVar15;
  FortunaRNG RNG;
  SequenceParser Parser;
  MXFWriter Writer;
  WriterInfo Info;
  FrameBuffer FrameBuffer;
  AtmosDescriptor ADesc;
  byte_t IV_buf [16];
  FortunaRNG local_261;
  HMACContext *local_260;
  AESEncContext *local_258;
  SequenceParser local_250 [16];
  undefined1 local_240 [81];
  bool bStack_1ef;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198 [2];
  LabelSet_t local_188;
  UUID local_180 [3];
  undefined1 local_118 [84];
  ui32_t local_c4;
  undefined2 local_c0;
  undefined2 local_be;
  uchar local_bc [16];
  undefined1 local_ac;
  undefined1 local_a8 [16];
  DCDataDescriptor local_98 [2];
  
  bVar15 = 0;
  ASDCP::ATMOS::MXFWriter::MXFWriter((MXFWriter *)local_240);
  ASDCP::DCData::FrameBuffer::FrameBuffer((FrameBuffer *)local_118,in_RSI->fb_size);
  local_118._40_4_ = 0;
  local_118._44_4_ = 0;
  ASDCP::DCData::SequenceParser::SequenceParser(local_250);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar1) {
    ASDCP::DCData::SequenceParser::FillDCDataDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    local_118._40_8_ = CommandOptions::PictureRate(in_RSI);
    local_c4 = in_RSI->ffoa;
    local_c0 = (undefined2)in_RSI->max_channel_count;
    local_be = (undefined2)in_RSI->max_object_count;
    Kumu::GenRandomUUID(local_bc);
    local_ac = 1;
    if (in_RSI->verbose_flag == true) {
      fwrite("Dolby ATMOS Data\n",0x11,1,_stderr);
      fputs("AtmosDescriptor:\n",_stderr);
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
      ASDCP::ATMOS::AtmosDescriptorDump((AtmosDescriptor *)(local_118 + 0x28),(_IO_FILE *)0x0);
    }
  }
  iVar2._0_1_ = Options->error_flag;
  iVar2._1_1_ = Options->key_flag;
  iVar2._2_1_ = Options->asset_id_flag;
  iVar2._3_1_ = Options->encrypt_header_flag;
  if ((iVar2 < 0) || (in_RSI->no_write_flag != false)) {
    local_260 = (HMACContext *)0x0;
    local_258 = (AESEncContext *)0x0;
  }
  else {
    pMVar12 = &s_MyInfo;
    puVar13 = (undefined8 *)(local_240 + 0x10);
    for (lVar11 = 8; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar13 = *(undefined8 *)(pMVar12->super_WriterInfo).ProductUUID;
      pMVar12 = (MyInfo *)((long)pMVar12 + ((ulong)bVar15 * -2 + 1) * 8);
      puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    }
    local_240[0x50] = s_MyInfo.super_WriterInfo.EncryptedEssence;
    bStack_1ef = s_MyInfo.super_WriterInfo.UsesHMAC;
    local_1e8._M_allocated_capacity = (size_type)local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
    local_1c8._M_allocated_capacity = (size_type)local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
    local_1a8._M_allocated_capacity = (size_type)local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductName._M_string_length);
    local_188 = s_MyInfo.super_WriterInfo.LabelSetType;
    if (in_RSI->asset_id_flag == true) {
      local_240._32_8_ = *(undefined8 *)in_RSI->asset_id_value;
      local_240._40_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
    }
    else {
      Kumu::GenRandomUUID(local_240 + 0x20);
    }
    local_188 = 2;
    if (in_RSI->key_flag == true) {
      Kumu::FortunaRNG::FortunaRNG(&local_261);
      Kumu::GenRandomUUID(local_240 + 0x30);
      local_240[0x50] = true;
      if (in_RSI->key_id_flag == true) {
        local_240._64_4_ = *(undefined4 *)in_RSI->key_id_value;
        local_240._68_4_ = *(undefined4 *)(in_RSI->key_id_value + 4);
        local_240._72_4_ = *(undefined4 *)(in_RSI->key_id_value + 8);
        local_240._76_4_ = *(undefined4 *)(in_RSI->key_id_value + 0xc);
      }
      else {
        local_180[0].super_Identifier<16U>.m_HasValue = false;
        local_180[0].super_Identifier<16U>.m_Value[0] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[1] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[2] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[3] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[4] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[5] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[6] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[7] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[8] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[9] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[10] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[0xb] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[0xc] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[0xd] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[0xe] = '\0';
        local_180[0].super_Identifier<16U>.m_Value[0xf] = '\0';
        local_180[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_00115b98;
        Kumu::GenRandomValue(local_180);
        local_240._64_4_ = local_180[0].super_Identifier<16U>.m_Value._0_4_;
        local_240._68_4_ = local_180[0].super_Identifier<16U>.m_Value._4_4_;
        local_240._72_4_ = local_180[0].super_Identifier<16U>.m_Value._8_4_;
        local_240._76_4_ = local_180[0].super_Identifier<16U>.m_Value._12_4_;
      }
      this_00 = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this_00);
      local_258 = this_00;
      ASDCP::AESEncContext::InitKey((uchar *)local_180);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_180);
      Kumu::Result_t::~Result_t((Result_t *)local_180);
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->asset_id_flag;
      iVar3._3_1_ = Options->encrypt_header_flag;
      if (-1 < iVar3) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_261,(uint)local_a8);
        ASDCP::AESEncContext::SetIVec((uchar *)local_180);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_180);
        Kumu::Result_t::~Result_t((Result_t *)local_180);
      }
      iVar4._0_1_ = Options->error_flag;
      iVar4._1_1_ = Options->key_flag;
      iVar4._2_1_ = Options->asset_id_flag;
      iVar4._3_1_ = Options->encrypt_header_flag;
      if ((iVar4 < 0) || (in_RSI->write_hmac != true)) {
        local_260 = (HMACContext *)0x0;
      }
      else {
        bStack_1ef = true;
        this_01 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_01);
        local_260 = this_01;
        ASDCP::HMACContext::InitKey((uchar *)local_180,(LabelSet_t)this_01);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_180);
        Kumu::Result_t::~Result_t((Result_t *)local_180);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_261);
    }
    else {
      local_260 = (HMACContext *)0x0;
      local_258 = (AESEncContext *)0x0;
    }
    iVar5._0_1_ = Options->error_flag;
    iVar5._1_1_ = Options->key_flag;
    iVar5._2_1_ = Options->asset_id_flag;
    iVar5._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar5) {
      ASDCP::ATMOS::MXFWriter::OpenWrite
                ((string *)local_180,(WriterInfo *)local_240,(AtmosDescriptor *)&in_RSI->out_file,
                 (int)local_240 + 0x10);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_180);
      Kumu::Result_t::~Result_t((Result_t *)local_180);
    }
    if ((long *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0] + 1);
    }
    if ((_Alloc_hider *)local_1c8._M_allocated_capacity != local_1b8) {
      operator_delete((void *)local_1c8._M_allocated_capacity,(ulong)(local_1b8[0]._M_p + 1));
    }
    if ((_Alloc_hider *)local_1e8._M_allocated_capacity != local_1d8) {
      operator_delete((void *)local_1e8._M_allocated_capacity,(ulong)(local_1d8[0]._M_p + 1));
    }
  }
  iVar6._0_1_ = Options->error_flag;
  iVar6._1_1_ = Options->key_flag;
  iVar6._2_1_ = Options->asset_id_flag;
  iVar6._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar6) {
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_240 + 0x10));
    Kumu::Result_t::~Result_t((Result_t *)(local_240 + 0x10));
    iVar10._0_1_ = Options->error_flag;
    iVar10._1_1_ = Options->key_flag;
    iVar10._2_1_ = Options->asset_id_flag;
    iVar10._3_1_ = Options->encrypt_header_flag;
    if ((-1 < iVar10) && (in_RSI->duration != 0)) {
      uVar14 = 0;
      this = (Result_t *)(local_240 + 0x10);
      do {
        ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)this);
        Kumu::Result_t::operator=((Result_t *)Options,this);
        Kumu::Result_t::~Result_t(this);
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar7) {
          if (in_RSI->verbose_flag == true) {
            ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)local_118,(uint)_stderr);
          }
          if (in_RSI->encrypt_header_flag == true) {
            local_118._36_4_ = 0;
          }
        }
        iVar8._0_1_ = Options->error_flag;
        iVar8._1_1_ = Options->key_flag;
        iVar8._2_1_ = Options->asset_id_flag;
        iVar8._3_1_ = Options->encrypt_header_flag;
        if ((-1 < iVar8) && (in_RSI->no_write_flag == false)) {
          ASDCP::ATMOS::MXFWriter::WriteFrame
                    ((FrameBuffer *)this,(AESEncContext *)local_240,(HMACContext *)local_118);
          Kumu::Result_t::operator=((Result_t *)Options,this);
          Kumu::Result_t::~Result_t(this);
        }
        iVar10._0_1_ = Options->error_flag;
        iVar10._1_1_ = Options->key_flag;
        iVar10._2_1_ = Options->asset_id_flag;
        iVar10._3_1_ = Options->encrypt_header_flag;
      } while ((-1 < iVar10) && (uVar14 = uVar14 + 1, uVar14 < in_RSI->duration));
    }
    if (iVar10 == Kumu::RESULT_ENDOFFILE) {
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
    }
  }
  iVar9._0_1_ = Options->error_flag;
  iVar9._1_1_ = Options->key_flag;
  iVar9._2_1_ = Options->asset_id_flag;
  iVar9._3_1_ = Options->encrypt_header_flag;
  if ((-1 < iVar9) && (in_RSI->no_write_flag == false)) {
    ASDCP::ATMOS::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_240 + 0x10));
    Kumu::Result_t::~Result_t((Result_t *)(local_240 + 0x10));
  }
  ASDCP::DCData::SequenceParser::~SequenceParser(local_250);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_118);
  ASDCP::ATMOS::MXFWriter::~MXFWriter((MXFWriter *)local_240);
  return Options;
}

Assistant:

Result_t
write_dolby_atmos_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  ATMOS::MXFWriter         Writer;
  DCData::FrameBuffer       FrameBuffer(Options.fb_size);
  ATMOS::AtmosDescriptor ADesc;
  DCData::SequenceParser    Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(ADesc);
    ADesc.EditRate = Options.PictureRate();
    // TODO: fill AtmosDescriptor
    ADesc.FirstFrame = Options.ffoa;
    ADesc.MaxChannelCount = Options.max_channel_count;
    ADesc.MaxObjectCount = Options.max_object_count;
    Kumu::GenRandomUUID(ADesc.AtmosID);
    ADesc.AtmosVersion = 1;
    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Dolby ATMOS Data\n");
	  fputs("AtmosDescriptor:\n", stderr);
      fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
      ATMOS::AtmosDescriptorDump(ADesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, ADesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}